

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O0

void __thiscall
QMakeSourceFileInfo::dependTreeWalker
          (QMakeSourceFileInfo *this,SourceFile *node,SourceDependChildren *place)

{
  SourceFile *in_RDX;
  QMakeSourceFileInfo *in_RSI;
  SourceFile *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  
  if (((*(byte *)((long)&(in_RSI->systemIncludes).d.d + 4) >> 1 & 1) == 0) &&
     ((*(byte *)((long)&(in_RSI->systemIncludes).d.d + 4) >> 2 & 1) != 0)) {
    SourceDependChildren::addChild
              ((SourceDependChildren *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
               ,in_RDI);
    *(byte *)((long)&(in_RSI->systemIncludes).d.d + 4) =
         *(byte *)((long)&(in_RSI->systemIncludes).d.d + 4) & 0xfd | 2;
    if ((in_RSI->depdirs).d.size != 0) {
      for (iVar1 = 0; iVar1 < *(int *)((in_RSI->depdirs).d.size + 0xc); iVar1 = iVar1 + 1) {
        dependTreeWalker(in_RSI,in_RDX,
                         (SourceDependChildren *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
      }
    }
  }
  return;
}

Assistant:

void QMakeSourceFileInfo::dependTreeWalker(SourceFile *node, SourceDependChildren *place)
{
    if(node->traversed || !node->exists)
        return;
    place->addChild(node);
    node->traversed = true; //set flag
    if(node->deps) {
        for(int i = 0; i < node->deps->used_nodes; i++)
            dependTreeWalker(node->deps->children[i], place);
    }
}